

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

void ctx_modules_undo_backlinks(ly_ctx *ctx,ly_set *mods)

{
  uint uVar1;
  lys_module *plVar2;
  lys_node *plVar3;
  int iVar4;
  long lVar5;
  lys_node *node;
  ly_set *plVar6;
  lys_node *plVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  
  if (4 < (ctx->models).used) {
    lVar5 = 4;
    do {
      plVar2 = (ctx->models).list[lVar5];
      if (plVar2->features_size != '\0') {
        uVar8 = 0;
        do {
          if (plVar2->features[uVar8].depfeatures != (ly_set *)0x0) {
            plVar6 = plVar2->features[uVar8].depfeatures;
            if (plVar6->number == 0) {
              bVar11 = true;
            }
            else {
              uVar10 = 0;
              do {
                uVar9 = (uint)uVar10;
                if ((mods == (ly_set *)0x0) ||
                   (iVar4 = ly_set_contains(mods,(plVar6->set).s[uVar10]->module), iVar4 != -1)) {
                  ly_set_rm_index(plVar2->features[uVar8].depfeatures,uVar9);
                  uVar9 = uVar9 - 1;
                }
                uVar10 = (ulong)(uVar9 + 1);
                plVar6 = plVar2->features[uVar8].depfeatures;
              } while (uVar9 + 1 < plVar6->number);
              bVar11 = plVar6->number == 0;
            }
            if (bVar11) {
              ly_set_free(plVar6);
              plVar2->features[uVar8].depfeatures = (ly_set *)0x0;
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < plVar2->features_size);
      }
      if (plVar2->ident_size != 0) {
        uVar8 = 0;
        do {
          if (plVar2->ident[uVar8].der != (ly_set *)0x0) {
            plVar6 = plVar2->ident[uVar8].der;
            if (plVar6->number == 0) {
              bVar11 = true;
            }
            else {
              uVar10 = 0;
              do {
                uVar9 = (uint)uVar10;
                if ((mods == (ly_set *)0x0) ||
                   (iVar4 = ly_set_contains(mods,(plVar6->set).s[uVar10]->module), iVar4 != -1)) {
                  ly_set_rm_index(plVar2->ident[uVar8].der,uVar9);
                  uVar9 = uVar9 - 1;
                }
                uVar10 = (ulong)(uVar9 + 1);
                plVar6 = plVar2->ident[uVar8].der;
              } while (uVar9 + 1 < plVar6->number);
              bVar11 = plVar6->number == 0;
            }
            if (bVar11) {
              ly_set_free(plVar6);
              plVar2->ident[uVar8].der = (ly_set *)0x0;
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < plVar2->ident_size);
      }
      plVar3 = plVar2->data;
      while (plVar3 != (lys_node *)0x0) {
        if (((plVar3->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
           (plVar7 = plVar3->child, plVar7 != (lys_node *)0x0)) {
          if (mods != (ly_set *)0x0) {
            plVar7 = plVar3->child;
            if (*(int *)((long)&plVar7->name + 4) == 0) {
              bVar11 = true;
            }
            else {
              uVar8 = 0;
              do {
                uVar9 = (uint)uVar8;
                iVar4 = ly_set_contains(mods,*(void **)(*(long *)(plVar7->dsc + uVar8 * 8) + 0x30));
                if (iVar4 != -1) {
                  ly_set_rm_index((ly_set *)plVar3->child,uVar9);
                  uVar9 = uVar9 - 1;
                }
                uVar8 = (ulong)(uVar9 + 1);
                plVar7 = plVar3->child;
                uVar1 = *(uint *)((long)&plVar7->name + 4);
              } while (uVar9 + 1 < uVar1);
              bVar11 = uVar1 == 0;
            }
            if (!bVar11) goto LAB_00110f21;
          }
          ly_set_free((ly_set *)plVar7);
          plVar3->child = (lys_node *)0x0;
        }
LAB_00110f21:
        if ((plVar3->nodetype & 0x882c) == LYS_UNKNOWN) {
          plVar7 = plVar3->child;
        }
        else {
          plVar7 = (lys_node *)0x0;
        }
        node = plVar3;
        if (plVar7 == (lys_node *)0x0) {
          plVar7 = plVar3->next;
        }
        while ((plVar3 = plVar7, plVar3 == (lys_node *)0x0 &&
               (node = lys_parent(node), node != (lys_node *)0x0))) {
          plVar7 = node->next;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (ctx->models).used);
  }
  return;
}

Assistant:

static void
ctx_modules_undo_backlinks(struct ly_ctx *ctx, struct ly_set *mods)
{
    int o;
    uint8_t j;
    unsigned int u, v;
    struct lys_module *mod;
    struct lys_node *elem, *next;
    struct lys_node_leaf *leaf;

    /* maintain backlinks (start with internal ietf-yang-library which have leafs as possible targets of leafrefs */
    for (o = INTERNAL_MODULES_COUNT - 1; o < ctx->models.used; o++) {
        mod = ctx->models.list[o]; /* shortcut */

        /* 1) features */
        for (j = 0; j < mod->features_size; j++) {
            if (!mod->features[j].depfeatures) {
                continue;
            }
            for (v = 0; v < mod->features[j].depfeatures->number; v++) {
                if (!mods || ly_set_contains(mods, ((struct lys_feature *)mod->features[j].depfeatures->set.g[v])->module) != -1) {
                    /* depending feature is in module to remove */
                    ly_set_rm_index(mod->features[j].depfeatures, v);
                    v--;
                }
            }
            if (!mod->features[j].depfeatures->number) {
                /* all backlinks removed */
                ly_set_free(mod->features[j].depfeatures);
                mod->features[j].depfeatures = NULL;
            }
        }

        /* 2) identities */
        for (u = 0; u < mod->ident_size; u++) {
            if (!mod->ident[u].der) {
                continue;
            }
            for (v = 0; v < mod->ident[u].der->number; v++) {
                if (!mods || ly_set_contains(mods, ((struct lys_ident *)mod->ident[u].der->set.g[v])->module) != -1) {
                    /* derived identity is in module to remove */
                    ly_set_rm_index(mod->ident[u].der, v);
                    v--;
                }
            }
            if (!mod->ident[u].der->number) {
                /* all backlinks removed */
                ly_set_free(mod->ident[u].der);
                mod->ident[u].der = NULL;
            }
        }

        /* 3) leafrefs */
        for (elem = next = mod->data; elem; elem = next) {
            if (elem->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                leaf = (struct lys_node_leaf *)elem; /* shortcut */
                if (leaf->backlinks) {
                    if (!mods) {
                        /* remove all backlinks */
                        ly_set_free(leaf->backlinks);
                        leaf->backlinks = NULL;
                    } else {
                        for (v = 0; v < leaf->backlinks->number; v++) {
                            if (ly_set_contains(mods, leaf->backlinks->set.s[v]->module) != -1) {
                                /* derived identity is in module to remove */
                                ly_set_rm_index(leaf->backlinks, v);
                                v--;
                            }
                        }
                        if (!leaf->backlinks->number) {
                            /* all backlinks removed */
                            ly_set_free(leaf->backlinks);
                            leaf->backlinks = NULL;
                        }
                    }
                }
            }

            /* select next element to process */
            next = elem->child;
            /* child exception for leafs, leaflists, anyxml and groupings */
            if (elem->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA | LYS_GROUPING)) {
                next = NULL;
            }
            if (!next) {
                /* no children,  try siblings */
                next = elem->next;
            }
            while (!next) {
                /* parent is already processed, go to its sibling */
                elem = lys_parent(elem);
                if (!elem) {
                    /* we are done, no next element to process */
                    break;
                }
                /* no siblings, go back through parents */
                next = elem->next;
            }
        }
    }
}